

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O3

void cjson_get_object_item_should_not_crash_with_array(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = cJSON_ParseWithLengthOpts("[1]",4,(char **)0x0,0);
  pcVar1 = get_object_item(object,"name",0);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0x88);
  }
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_get_object_item_should_not_crash_with_array(void) {
    cJSON *array = NULL;
    cJSON *found = NULL;
    array = cJSON_Parse("[1]");

    found = cJSON_GetObjectItem(array, "name");
    TEST_ASSERT_NULL(found);

    cJSON_Delete(array);
}